

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ansv.cpp
# Opt level: O1

void par_test_ansv_localidx<unsigned_long,1,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,comm *c)

{
  pointer puVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_00;
  bool bVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  MPI_Comm expected_predicate_value;
  int result;
  AssertionResult gtest_ar_;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> right_nsv;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_nsv;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  lr_mins;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  internal local_e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  string local_d8;
  AssertHelper local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  mxx::impl::distribute_container<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  stable_distribute(&local_b0,in,c);
  local_d8._M_dataplus._M_p =
       (pointer)((long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
  uVar3 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_d8,c);
  uVar6 = 0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ansv<unsigned_long,1,1,1>(&local_b0,&local_78,&local_98,&local_58,c,0xffffffffffffffff);
  if ((long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
    uVar6 = (uint)((long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start ==
                  (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  }
  local_d8._M_dataplus._M_p._0_4_ = uVar6;
  expected_predicate_value = c->mpi_comm;
  MPI_Allreduce(&local_d8,&local_f0,1,&ompi_mpi_int,&ompi_mpi_op_land);
  local_e8[0] = (internal)((int)local_f0.ptr_ != 0);
  local_e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((int)local_f0.ptr_ == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,local_e8,
               (AssertionResult *)
               "mxx::all_of(vec.size() == left_nsv.size() && vec.size() == right_nsv.size(), c)",
               "false","true",(char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
               ,0xa3,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    local_38 = in;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      uVar4 = (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      uVar7 = 0;
      do {
        uVar5 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        if (uVar5 != 0xffffffffffffffff) {
          if (uVar5 < uVar4) {
            local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] = uVar5 + uVar3;
          }
          else {
            if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7] < uVar4) {
              local_e8[0] = (internal)0x0;
LAB_001233bc:
              local_e0.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::Message::Message((Message *)&local_f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_d8,local_e8,
                         (AssertionResult *)
                         "left_nsv[i] >= vec.size() && left_nsv[i] < vec.size()+lr_mins.size()",
                         "false","true",(char *)expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0xb4,local_d8._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f0);
              testing::internal::AssertHelper::~AssertHelper(&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p);
              }
              if (local_f0.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   (local_f0.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_f0.ptr_ + 8))();
                }
                local_f0.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            else {
              local_e8[0] = (internal)
                            (local_78.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar7] <
                            ((long)local_58.
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4) + uVar4);
              local_e0.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_e8[0]) goto LAB_001233bc;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_e0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] =
                 local_58.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar7] -
                  ((ulong)((long)local_b0.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3)].second;
          }
        }
        uVar4 = local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        if (uVar4 != 0xffffffffffffffff) {
          uVar5 = (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3;
          if (uVar4 < uVar5) {
            local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] = uVar4 + uVar3;
          }
          else {
            if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7] < uVar5) {
              local_e8[0] = (internal)0x0;
LAB_0012350f:
              local_e0.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::Message::Message((Message *)&local_f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_d8,local_e8,
                         (AssertionResult *)
                         "right_nsv[i] >= vec.size() && right_nsv[i] < vec.size()+lr_mins.size()",
                         "false","true",(char *)expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0xbe,local_d8._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f0);
              testing::internal::AssertHelper::~AssertHelper(&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p);
              }
              if (local_f0.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   (local_f0.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_f0.ptr_ + 8))();
                }
                local_f0.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            else {
              local_e8[0] = (internal)
                            (local_98.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar7] <
                            ((long)local_58.
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4) + uVar5);
              local_e0.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_e8[0]) goto LAB_0012350f;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_e0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] =
                 local_58.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar7] -
                  ((ulong)((long)local_b0.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3)].second;
          }
        }
        uVar7 = uVar7 + 1;
        uVar4 = (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
      } while (uVar7 < uVar4);
    }
    mxx::gatherv<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
               local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,0,c);
    in_00 = local_38;
    puVar1 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_d8._M_dataplus._M_p;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_d8._M_string_length;
    local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_d8.field_2._M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    if (puVar1 != (unsigned_long *)0x0) {
      operator_delete(puVar1);
    }
    if ((unsigned_long *)local_d8._M_dataplus._M_p != (unsigned_long *)0x0) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    mxx::gatherv<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
               local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,0,c);
    puVar1 = local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_d8._M_dataplus._M_p;
    local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_d8._M_string_length;
    local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_d8.field_2._M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)0x0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    if (puVar1 != (unsigned_long *)0x0) {
      operator_delete(puVar1);
    }
    if ((unsigned_long *)local_d8._M_dataplus._M_p != (unsigned_long *)0x0) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (c->m_rank == 0) {
      check_ansv<unsigned_long,1>(in_00,&local_78,true,0xffffffffffffffff);
      check_ansv<unsigned_long,1>(in_00,&local_98,false,0xffffffffffffffff);
    }
  }
  if (local_58.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void par_test_ansv_localidx(const std::vector<T>& in, const mxx::comm& c) {
    std::vector<size_t> vec = mxx::stable_distribute(in, c);

    size_t prefix = mxx::exscan(vec.size(), c);

    // calc ansv
    std::vector<size_t> left_nsv;
    std::vector<size_t> right_nsv;
    std::vector<std::pair<T, size_t>> lr_mins;

    const size_t nonsv = std::numeric_limits<size_t>::max();
    ansv<T,left_type,right_type,local_indexing>(vec, left_nsv, right_nsv, lr_mins, c, nonsv);
    ASSERT_TRUE(mxx::all_of(vec.size() == left_nsv.size() && vec.size() == right_nsv.size(), c));

    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: in=" << in << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: vec=" << vec << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: left=" << left_nsv << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: right=" << right_nsv << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: lrmin=" << lr_mins << std::endl;

    // resolve local indexing into global indexing
    // FIXME: now we actually have to use a special value for non-matched
    for (size_t i = 0; i < vec.size(); ++i) {
        // resolve left
        if (left_nsv[i] != nonsv) {
            if (left_nsv[i] < vec.size()) {
                // this is a local element, add prefix
                left_nsv[i] += prefix;
            } else {
                EXPECT_TRUE(left_nsv[i] >= vec.size() && left_nsv[i] < vec.size()+lr_mins.size());
                left_nsv[i] = lr_mins[left_nsv[i]-vec.size()].second;
            }
        }
        // resolve right
        if (right_nsv[i] != nonsv) {
            if (right_nsv[i] < vec.size()) {
                // this is a local element, add prefix
                right_nsv[i] += prefix;
            } else {
                EXPECT_TRUE(right_nsv[i] >= vec.size() && right_nsv[i] < vec.size()+lr_mins.size());
                right_nsv[i] = lr_mins[right_nsv[i]-vec.size()].second;
            }
        }
    }


    left_nsv = mxx::gatherv(left_nsv, 0, c);
    right_nsv = mxx::gatherv(right_nsv, 0, c);

    if (c.rank() == 0) {
        check_ansv<T,left_type>(in, left_nsv, true, nonsv);
        check_ansv<T,right_type>(in, right_nsv, false, nonsv);
    }
}